

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O1

void __thiscall
cppcms::triggers_recorder::triggers_recorder(triggers_recorder *this,cache_interface *cache)

{
  _Rb_tree_header *p_Var1;
  triggers_recorder *local_18;
  
  (this->d).ptr_ = (data *)0x0;
  p_Var1 = &(this->triggers_)._M_t._M_impl.super__Rb_tree_header;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->triggers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cache_ = cache;
  local_18 = this;
  std::
  _Rb_tree<cppcms::triggers_recorder*,cppcms::triggers_recorder*,std::_Identity<cppcms::triggers_recorder*>,std::less<cppcms::triggers_recorder*>,std::allocator<cppcms::triggers_recorder*>>
  ::_M_insert_unique<cppcms::triggers_recorder*const&>
            ((_Rb_tree<cppcms::triggers_recorder*,cppcms::triggers_recorder*,std::_Identity<cppcms::triggers_recorder*>,std::less<cppcms::triggers_recorder*>,std::allocator<cppcms::triggers_recorder*>>
              *)&cache->recorders_,&local_18);
  return;
}

Assistant:

triggers_recorder::triggers_recorder(cache_interface &cache):
	cache_(&cache)
{
	cache_->add_triggers_recorder(this);
}